

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O3

void __thiscall hmac_hash::SHA1::update(SHA1 *this,uchar *message,size_t length)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  size_t i_1;
  size_t i;
  pointer puVar4;
  long lVar5;
  ulong uVar6;
  uchar *puVar7;
  uint32_t block [16];
  uint32_t local_78 [18];
  
  puVar4 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)puVar4 - (long)puVar2;
  if (lVar5 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = lVar5 + 0x40;
    if (length <= uVar6) {
      uVar6 = length;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_buffer,puVar2,message
               ,message + uVar6);
    puVar2 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((long)puVar4 - (long)puVar2 == 0x40) {
      lVar5 = 0;
      do {
        uVar1 = *(uint *)(puVar2 + lVar5 * 4);
        local_78[lVar5] =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      transform(this,local_78);
      puVar4 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish != puVar4) {
        (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar4;
      }
    }
  }
  if (uVar6 + 0x40 <= length) {
    puVar7 = message + uVar6 + 3;
    uVar3 = uVar6 + 0x40;
    do {
      uVar6 = uVar3;
      lVar5 = 0;
      do {
        uVar1 = *(uint *)(puVar7 + lVar5 * 4 + -3);
        local_78[lVar5] =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      transform(this,local_78);
      puVar7 = puVar7 + 0x40;
      uVar3 = uVar6 + 0x40;
    } while (uVar6 + 0x40 <= length);
    puVar4 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_buffer,puVar4,
             message + uVar6,message + length);
  return;
}

Assistant:

void SHA1::update(const unsigned char *message, size_t length) {
        size_t offset = 0;

        // Fill buffer if it has existing bytes
        if (!m_buffer.empty()) {
            size_t to_copy = std::min(BLOCK_SIZE - m_buffer.size(), length);
            m_buffer.insert(m_buffer.end(), message, message + to_copy);
            offset += to_copy;

            if (m_buffer.size() == BLOCK_SIZE) {
                uint32_t block[16];
                buffer_to_block(m_buffer.data(), block);
                transform(block);
                m_buffer.clear();
            }
        }

        // Process full blocks directly from message
        while (offset + BLOCK_SIZE <= length) {
            uint32_t block[16];
            buffer_to_block(message + offset, block);
            transform(block);
            offset += BLOCK_SIZE;
        }

        // Store remaining bytes in buffer
        m_buffer.insert(m_buffer.end(), message + offset, message + length);
    }